

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_read(connectdata *conn,curl_socket_t sockfd,char *buf,size_t sizerequested,ssize_t *n)

{
  int iVar1;
  Curl_easy *pCVar2;
  bool bVar3;
  _Bool _Var4;
  size_t __n;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  CURLcode result;
  CURLcode local_34;
  
  local_34 = CURLE_RECV_ERROR;
  pCVar2 = conn->data;
  _Var4 = Curl_pipeline_wanted(pCVar2->multi,1);
  if (_Var4) {
    uVar6 = (ulong)(conn->sock[1] == sockfd);
    iVar1 = conn->bundle->multiuse;
    *n = 0;
    if (iVar1 == 1) {
      uVar7 = conn->buf_len - conn->read_pos;
      if (sizerequested <= uVar7) {
        uVar7 = sizerequested;
      }
      if (uVar7 != 0) {
        memcpy(buf,conn->master_buffer + conn->read_pos,uVar7);
        conn->read_pos = conn->read_pos + uVar7;
        (conn->bits).stream_was_rewound = false;
        *n = uVar7;
        return CURLE_OK;
      }
      if (0x3fff < sizerequested) {
        sizerequested = 0x4000;
      }
      bVar3 = true;
      pcVar5 = conn->master_buffer;
      goto LAB_00113e2d;
    }
  }
  else {
    uVar6 = (ulong)(conn->sock[1] == sockfd);
    *n = 0;
  }
  uVar7 = (pCVar2->set).buffer_size;
  if (uVar7 < sizerequested) {
    sizerequested = uVar7;
  }
  bVar3 = false;
  pcVar5 = buf;
LAB_00113e2d:
  __n = (*conn->recv[uVar6])(conn,(int)uVar6,pcVar5,sizerequested,&local_34);
  if (-1 < (long)__n) {
    if (bVar3) {
      memcpy(buf,conn->master_buffer,__n);
      conn->buf_len = __n;
      conn->read_pos = __n;
    }
    *n = *n + __n;
    return CURLE_OK;
  }
  return local_34;
}

Assistant:

CURLcode Curl_read(struct connectdata *conn, /* connection data */
                   curl_socket_t sockfd,     /* read from this socket */
                   char *buf,                /* store read data here */
                   size_t sizerequested,     /* max amount to read */
                   ssize_t *n)               /* amount bytes read */
{
  CURLcode result = CURLE_RECV_ERROR;
  ssize_t nread = 0;
  size_t bytesfromsocket = 0;
  char *buffertofill = NULL;
  struct Curl_easy *data = conn->data;

  /* if HTTP/1 pipelining is both wanted and possible */
  bool pipelining = Curl_pipeline_wanted(data->multi, CURLPIPE_HTTP1) &&
    (conn->bundle->multiuse == BUNDLE_PIPELINING);

  /* Set 'num' to 0 or 1, depending on which socket that has been sent here.
     If it is the second socket, we set num to 1. Otherwise to 0. This lets
     us use the correct ssl handle. */
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  *n = 0; /* reset amount to zero */

  /* If session can pipeline, check connection buffer  */
  if(pipelining) {
    size_t bytestocopy = CURLMIN(conn->buf_len - conn->read_pos,
                                 sizerequested);

    /* Copy from our master buffer first if we have some unread data there*/
    if(bytestocopy > 0) {
      memcpy(buf, conn->master_buffer + conn->read_pos, bytestocopy);
      conn->read_pos += bytestocopy;
      conn->bits.stream_was_rewound = FALSE;

      *n = (ssize_t)bytestocopy;
      return CURLE_OK;
    }
    /* If we come here, it means that there is no data to read from the buffer,
     * so we read from the socket */
    bytesfromsocket = CURLMIN(sizerequested, MASTERBUF_SIZE);
    buffertofill = conn->master_buffer;
  }
  else {
    bytesfromsocket = CURLMIN(sizerequested, (size_t)data->set.buffer_size);
    buffertofill = buf;
  }

  nread = conn->recv[num](conn, num, buffertofill, bytesfromsocket, &result);
  if(nread < 0)
    return result;

  if(pipelining) {
    memcpy(buf, conn->master_buffer, nread);
    conn->buf_len = nread;
    conn->read_pos = nread;
  }

  *n += nread;

  return CURLE_OK;
}